

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O0

void __thiscall
TPZStack<MaterialDataV,_10>::Push(TPZStack<MaterialDataV,_10> *this,MaterialDataV *object)

{
  int64_t iVar1;
  MaterialDataV *in_RDI;
  MaterialDataV *in_stack_ffffffffffffffd8;
  
  iVar1 = TPZVec<MaterialDataV>::NElements((TPZVec<MaterialDataV> *)in_RDI);
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,iVar1 + 1);
  iVar1 = TPZVec<MaterialDataV>::NElements((TPZVec<MaterialDataV> *)in_RDI);
  TPZVec<MaterialDataV>::operator[]((TPZVec<MaterialDataV> *)in_RDI,iVar1 + -1);
  MaterialDataV::operator=(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void TPZStack<T, NumExtAlloc>::Push(const T object) {
	this->Resize(this->NElements()+1);
	this->operator[](this->NElements()-1) = object;
}